

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_dynamic.cpp
# Opt level: O3

void multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_short>
               (uchar **strings,size_t N,size_t depth)

{
  uchar *puVar1;
  pointer pppuVar2;
  pointer pppuVar3;
  pointer pppuVar4;
  pointer pppuVar5;
  pointer pppuVar6;
  pointer pppuVar7;
  unsigned_short uVar8;
  uint j;
  long lVar9;
  ushort uVar10;
  size_t sVar11;
  size_t N_00;
  ulong uVar12;
  ulong uVar13;
  size_t N_01;
  ulong uVar14;
  ulong uVar15;
  uint j_1;
  uchar **ppuVar16;
  ulong uVar17;
  ulong uVar18;
  uchar **ppuVar19;
  size_t N_02;
  array<vector_block<unsigned_char_*,_1024U>,_3UL> buckets;
  array<unsigned_short,_32UL> cache;
  vector_block<unsigned_char_*,_1024U> local_e8;
  vector_block<unsigned_char_*,_1024U> local_c0;
  vector_block<unsigned_char_*,_1024U> local_98;
  ushort auStack_70 [32];
  
  if (N < 10000) {
    mkqsort(strings,(int)N,(int)depth);
    return;
  }
  local_e8._left_in_block = 0;
  local_e8._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8._insertpos = (uchar **)0x0;
  local_e8._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0._insertpos = (uchar **)0x0;
  local_c0._left_in_block = 0;
  local_98._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._insertpos = (uchar **)0x0;
  local_98._left_in_block = 0;
  uVar8 = pseudo_median<unsigned_short>(strings,N,depth);
  if ((N & 0xffffffffffffffe0) == 0) {
    uVar17 = 0;
  }
  else {
    uVar17 = 0;
    ppuVar16 = strings;
    do {
      lVar9 = 0;
      do {
        puVar1 = ppuVar16[lVar9];
        if (puVar1 == (uchar *)0x0) goto LAB_001b7d29;
        if (puVar1[depth] == '\0') {
          uVar10 = 0;
        }
        else {
          uVar10 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
        }
        auStack_70[lVar9] = uVar10;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x20);
      lVar9 = 0;
      ppuVar19 = ppuVar16;
      do {
        vector_block<unsigned_char_*,_1024U>::push_back
                  (&local_e8 +
                   (ulong)(auStack_70[lVar9] == uVar8) + (ulong)(uVar8 < auStack_70[lVar9]) * 2,
                   ppuVar19);
        lVar9 = lVar9 + 1;
        ppuVar19 = ppuVar19 + 1;
      } while (lVar9 != 0x20);
      uVar17 = uVar17 + 0x20;
      ppuVar16 = ppuVar16 + 0x20;
    } while (uVar17 < (N & 0xffffffffffffffe0));
  }
  lVar9 = N - uVar17;
  if (uVar17 <= N && lVar9 != 0) {
    ppuVar16 = strings + uVar17;
    do {
      puVar1 = *ppuVar16;
      if (puVar1 == (uchar *)0x0) {
LAB_001b7d29:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar1[depth] == '\0') {
        uVar10 = 0;
      }
      else {
        uVar10 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
      }
      vector_block<unsigned_char_*,_1024U>::push_back
                (&local_e8 + (ulong)(uVar10 == uVar8) + (ulong)(uVar8 < uVar10) * 2,ppuVar16);
      ppuVar16 = ppuVar16 + 1;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  pppuVar7 = local_98._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pppuVar6 = local_98._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_start;
  pppuVar5 = local_c0._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pppuVar4 = local_c0._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_start;
  pppuVar3 = local_e8._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pppuVar2 = local_e8._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_start;
  uVar17 = (long)local_e8._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_e8._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_start;
  N_00 = uVar17 * 0x80 - (ulong)local_e8._left_in_block;
  uVar12 = (long)local_c0._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_c0._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_start;
  uVar15 = (ulong)local_c0._left_in_block;
  N_02 = uVar12 * 0x80 - uVar15;
  uVar13 = (long)local_98._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_98._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_start;
  uVar14 = (ulong)local_98._left_in_block;
  N_01 = uVar13 * 0x80 - uVar14;
  if (N_00 + N_02 + N_01 != N) {
    __assert_fail("bucketsize0 + bucketsize1 + bucketsize2 == N",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_dynamic.cpp"
                  ,0x5d,
                  "void multikey_dynamic(unsigned char **, size_t, size_t) [BucketT = vector_block<unsigned char *>, CharT = unsigned short]"
                 );
  }
  if (uVar17 * 0x80 != (ulong)local_e8._left_in_block) {
    if (local_e8._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_e8._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001b7d48;
    ppuVar16 = strings;
    if (8 < uVar17) {
      uVar18 = 2;
      if (2 < (ulong)((long)uVar17 >> 3)) {
        uVar18 = (long)uVar17 >> 3;
      }
      lVar9 = 0;
      do {
        memmove(ppuVar16,pppuVar2[lVar9],0x2000);
        ppuVar16 = ppuVar16 + 0x400;
        lVar9 = lVar9 + 1;
      } while (uVar18 - 1 != lVar9);
    }
    sVar11 = (long)local_e8._insertpos - (long)pppuVar3[-1];
    if (sVar11 != 0) {
      memmove(ppuVar16,pppuVar3[-1],sVar11);
    }
  }
  if (uVar12 * 0x80 != uVar15) {
    if (pppuVar4 == pppuVar5) goto LAB_001b7d48;
    ppuVar16 = strings + N_00;
    if (8 < uVar12) {
      uVar17 = 2;
      if (2 < (ulong)((long)uVar12 >> 3)) {
        uVar17 = (long)uVar12 >> 3;
      }
      lVar9 = 0;
      do {
        memmove(ppuVar16,pppuVar4[lVar9],0x2000);
        ppuVar16 = ppuVar16 + 0x400;
        lVar9 = lVar9 + 1;
      } while (uVar17 - 1 != lVar9);
    }
    ppuVar19 = pppuVar5[-1];
    sVar11 = (long)local_c0._insertpos - (long)ppuVar19;
    if (sVar11 != 0) {
      memmove(ppuVar16,ppuVar19,sVar11);
    }
  }
  if (uVar13 * 0x80 != uVar14) {
    if (pppuVar6 == pppuVar7) {
LAB_001b7d48:
      __assert_fail("not v._index_block.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/vector_block.h"
                    ,0x5b,
                    "void copy(const vector_block<T, B> &, OutputIterator) [T = unsigned char *, B = 1024U, OutputIterator = unsigned char **]"
                   );
    }
    ppuVar16 = strings + N_00 + N_02;
    if (8 < uVar13) {
      uVar17 = 2;
      if (2 < (ulong)((long)uVar13 >> 3)) {
        uVar17 = (long)uVar13 >> 3;
      }
      lVar9 = 0;
      do {
        memmove(ppuVar16,pppuVar6[lVar9],0x2000);
        ppuVar16 = ppuVar16 + 0x400;
        lVar9 = lVar9 + 1;
      } while (uVar17 - 1 != lVar9);
    }
    ppuVar19 = pppuVar7[-1];
    sVar11 = (long)local_98._insertpos - (long)ppuVar19;
    if (sVar11 != 0) {
      memmove(ppuVar16,ppuVar19,sVar11);
    }
  }
  vector_block<unsigned_char_*,_1024U>::clear(&local_e8);
  vector_block<unsigned_char_*,_1024U>::clear(&local_c0);
  vector_block<unsigned_char_*,_1024U>::clear(&local_98);
  multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_short>(strings,N_00,depth);
  if ((char)uVar8 != '\0') {
    multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_short>
              (strings + N_00,N_02,depth + 2);
  }
  multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_short>
            (strings + N_00 + N_02,N_01,depth);
  lVar9 = 0x50;
  do {
    vector_block<unsigned_char_*,_1024U>::~vector_block
              ((vector_block<unsigned_char_*,_1024U> *)
               ((long)&local_e8._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar9));
    lVar9 = lVar9 + -0x28;
  } while (lVar9 != -0x28);
  return;
}

Assistant:

static void
multikey_dynamic(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 10000) {
		mkqsort(strings, N, depth);
		return;
	}
	std::array<BucketT, 3> buckets;
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < N-N%32; i+=32) {
		std::array<CharT, 32> cache;
		for (unsigned j=0; j<32; ++j) {
			cache[j] = get_char<CharT>(strings[i+j], depth);
		}
		for (unsigned j=0; j<32; ++j) {
			const unsigned b = get_bucket(cache[j], partval);
			buckets[b].push_back(strings[i+j]);
		}
	}
	for (; i < N; ++i) {
		const CharT c = get_char<CharT>(strings[i], depth);
		const unsigned b = get_bucket(c, partval);
		buckets[b].push_back(strings[i]);
	}
	const size_t bucketsize0 = buckets[0].size();
	const size_t bucketsize1 = buckets[1].size();
	const size_t bucketsize2 = buckets[2].size();
	assert(bucketsize0 + bucketsize1 + bucketsize2 == N);
	if (bucketsize0) copy(buckets[0], strings);
	if (bucketsize1) copy(buckets[1], strings+bucketsize0);
	if (bucketsize2) copy(buckets[2], strings+bucketsize0+bucketsize1);
	clear_bucket(buckets[0]);
	clear_bucket(buckets[1]);
	clear_bucket(buckets[2]);
	multikey_dynamic<BucketT, CharT>(strings, bucketsize0, depth);
	if (not is_end(partval))
		multikey_dynamic<BucketT, CharT>(strings+bucketsize0,
				bucketsize1, depth+sizeof(CharT));
	multikey_dynamic<BucketT, CharT>(strings+bucketsize0+bucketsize1,
			bucketsize2, depth);
}